

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

string * __thiscall
google::protobuf::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,protobuf *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,
          AlphaNum *d,AlphaNum *e,AlphaNum *f,AlphaNum *g)

{
  char *out;
  size_t sVar1;
  char *pcVar2;
  LogMessage *other;
  LogFinisher local_71;
  AlphaNum *local_70;
  LogMessage local_68;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_70 = c;
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  out = (__return_storage_ptr__->_M_dataplus)._M_p;
  pcVar2 = Append4(out,(AlphaNum *)this,a,b,local_70);
  memcpy(pcVar2,d->piece_data_,d->piece_size_);
  pcVar2 = pcVar2 + d->piece_size_;
  memcpy(pcVar2,e->piece_data_,e->piece_size_);
  sVar1 = e->piece_size_;
  memcpy(pcVar2 + sVar1,f->piece_data_,f->piece_size_);
  if (pcVar2 + sVar1 + f->piece_size_ != out + __return_storage_ptr__->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x602);
    other = internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (out) == (begin + result.size()): ");
    internal::LogFinisher::operator=(&local_71,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

string StrCat(const AlphaNum &a, const AlphaNum &b, const AlphaNum &c,
              const AlphaNum &d, const AlphaNum &e, const AlphaNum &f,
              const AlphaNum &g) {
  string result;
  result.resize(a.size() + b.size() + c.size() + d.size() + e.size() +
                f.size() + g.size());
  char *const begin = &*result.begin();
  char *out = Append4(begin, a, b, c, d);
  out = Append2(out, e, f);
  out = Append1(out, g);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}